

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_combined(char *serialized_model,char *serialized_model_ext,char *serialized_imputer,
                       char *serialized_indexer,char *optional_metadata,
                       size_t size_optional_metadata,FILE *out)

{
  size_t in_stack_00000288;
  char *in_stack_00000290;
  char *in_stack_00000298;
  char *in_stack_000002a0;
  char *in_stack_000002a8;
  char *in_stack_000002b0;
  _IO_FILE **in_stack_000002c0;
  
  serialize_combined<_IO_FILE*>
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
             in_stack_00000290,in_stack_00000288,in_stack_000002c0);
  return;
}

Assistant:

void serialize_combined
(
    const char *serialized_model,
    const char *serialized_model_ext,
    const char *serialized_imputer,
    const char *serialized_indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    FILE *out
)
{
    serialize_combined<FILE*>(
        serialized_model,
        serialized_model_ext,
        serialized_imputer,
        serialized_indexer,
        optional_metadata,
        size_optional_metadata,
        out
    );
}